

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O1

PollResult __thiscall
Fossilize::ExternalReplayer::Impl::poll_progress(Impl *this,Progress *progress)

{
  __int_type _Var1;
  SharedControlBlock *pSVar2;
  __pid_t _Var3;
  uint uVar4;
  int iVar5;
  PollResult PVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  size_t __n;
  void *__src;
  bool bVar10;
  char buf [64];
  char local_78 [72];
  
  _Var1 = (this->shm_block->progress_complete).super___atomic_base<unsigned_int>._M_i;
  _Var3 = this->pid;
  if (_Var1 == 0 && _Var3 < 0) {
    return Error;
  }
  if (-1 < _Var3 && _Var1 == 0) {
    _Var3 = waitpid(_Var3,&this->wstatus,1);
    if (_Var3 < 1) {
      if (-1 < _Var3) goto LAB_00185821;
      piVar7 = __errno_location();
      this->wstatus = -*piVar7;
      this->synthesized_exit_code = true;
    }
    else {
      uVar4 = this->wstatus & 0x7f;
      if ((uVar4 != 0) && ((int)(uVar4 * 0x1000000 + 0x1000000) < 0x2000000)) goto LAB_00185821;
    }
    reset_pid(this);
  }
LAB_00185821:
  if ((this->shm_block->progress_started).super___atomic_base<unsigned_int>._M_i == 0) {
    PVar6 = ResultNotReady;
  }
  else {
    pSVar2 = this->shm_block;
    (progress->compute).total = (pSVar2->total_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).parsed = (pSVar2->parsed_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).parsed_fail =
         (pSVar2->parsed_compute_failures).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).skipped = (pSVar2->skipped_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).cached = (pSVar2->cached_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).completed =
         (pSVar2->successful_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).total = (pSVar2->total_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).parsed = (pSVar2->parsed_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).parsed_fail =
         (pSVar2->parsed_graphics_failures).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).skipped = (pSVar2->skipped_graphics).super___atomic_base<unsigned_int>._M_i
    ;
    (progress->graphics).cached = (pSVar2->cached_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).completed =
         (pSVar2->successful_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).total = (pSVar2->total_raytracing).super___atomic_base<unsigned_int>._M_i
    ;
    (progress->raytracing).parsed =
         (pSVar2->parsed_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).parsed_fail =
         (pSVar2->parsed_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).skipped =
         (pSVar2->skipped_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).cached =
         (pSVar2->cached_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).completed =
         (pSVar2->successful_raytracing).super___atomic_base<unsigned_int>._M_i;
    progress->completed_modules =
         (pSVar2->successful_modules).super___atomic_base<unsigned_int>._M_i;
    progress->missing_modules =
         (pSVar2->parsed_module_failures).super___atomic_base<unsigned_int>._M_i;
    progress->total_modules = (pSVar2->total_modules).super___atomic_base<unsigned_int>._M_i;
    progress->banned_modules = (pSVar2->banned_modules).super___atomic_base<unsigned_int>._M_i;
    progress->module_validation_failures =
         (pSVar2->module_validation_failures).super___atomic_base<unsigned_int>._M_i;
    progress->clean_crashes = (pSVar2->clean_process_deaths).super___atomic_base<unsigned_int>._M_i;
    progress->dirty_crashes = (pSVar2->dirty_process_deaths).super___atomic_base<unsigned_int>._M_i;
    progress->total_graphics_pipeline_blobs =
         (pSVar2->static_total_count_graphics).super___atomic_base<unsigned_int>._M_i;
    progress->total_compute_pipeline_blobs =
         (pSVar2->static_total_count_compute).super___atomic_base<unsigned_int>._M_i;
    progress->total_raytracing_pipeline_blobs =
         (pSVar2->static_total_count_raytracing).super___atomic_base<unsigned_int>._M_i;
    LOCK();
    iVar5 = pSVar2->futex_lock;
    bVar10 = iVar5 == 0;
    if (bVar10) {
      pSVar2->futex_lock = 1;
      iVar5 = 0;
    }
    UNLOCK();
    if (!bVar10) {
      piVar7 = &pSVar2->futex_lock;
      do {
        if (iVar5 == 2) {
LAB_00185944:
          syscall(0xca,piVar7,0,2,0,0,0);
        }
        else {
          LOCK();
          iVar5 = *piVar7;
          if (iVar5 == 1) {
            *piVar7 = 2;
            iVar5 = 1;
          }
          UNLOCK();
          if (iVar5 != 0) goto LAB_00185944;
        }
        LOCK();
        iVar5 = *piVar7;
        bVar10 = iVar5 == 0;
        if (bVar10) {
          *piVar7 = 2;
          iVar5 = 0;
        }
        UNLOCK();
      } while (!bVar10);
    }
    uVar4 = this->shm_block->write_count - this->shm_block->read_count;
    if (0x3f < uVar4) {
      uVar9 = 0x40;
      do {
        local_78[0x30] = '\0';
        local_78[0x31] = '\0';
        local_78[0x32] = '\0';
        local_78[0x33] = '\0';
        local_78[0x34] = '\0';
        local_78[0x35] = '\0';
        local_78[0x36] = '\0';
        local_78[0x37] = '\0';
        local_78[0x38] = '\0';
        local_78[0x39] = '\0';
        local_78[0x3a] = '\0';
        local_78[0x3b] = '\0';
        local_78[0x3c] = '\0';
        local_78[0x3d] = '\0';
        local_78[0x3e] = '\0';
        local_78[0x3f] = '\0';
        local_78[0x20] = '\0';
        local_78[0x21] = '\0';
        local_78[0x22] = '\0';
        local_78[0x23] = '\0';
        local_78[0x24] = '\0';
        local_78[0x25] = '\0';
        local_78[0x26] = '\0';
        local_78[0x27] = '\0';
        local_78[0x28] = '\0';
        local_78[0x29] = '\0';
        local_78[0x2a] = '\0';
        local_78[0x2b] = '\0';
        local_78[0x2c] = '\0';
        local_78[0x2d] = '\0';
        local_78[0x2e] = '\0';
        local_78[0x2f] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        local_78[0x18] = '\0';
        local_78[0x19] = '\0';
        local_78[0x1a] = '\0';
        local_78[0x1b] = '\0';
        local_78[0x1c] = '\0';
        local_78[0x1d] = '\0';
        local_78[0x1e] = '\0';
        local_78[0x1f] = '\0';
        local_78[0] = '\0';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        pSVar2 = this->shm_block;
        if ((0x3f < pSVar2->ring_buffer_size) && (0x3f < pSVar2->write_count - pSVar2->read_count))
        {
          __src = (void *)((long)&pSVar2->version_cookie + (ulong)pSVar2->ring_buffer_offset);
          uVar8 = pSVar2->ring_buffer_size - pSVar2->read_offset;
          __n = 0x40;
          if (uVar8 < 0x40) {
            __n = (size_t)uVar8;
          }
          memcpy(local_78,(void *)((ulong)pSVar2->read_offset + (long)__src),__n);
          if (uVar8 < 0x40) {
            memcpy(local_78 + __n,__src,(ulong)(0x40 - (int)__n));
          }
          pSVar2->read_offset = pSVar2->ring_buffer_size - 1 & pSVar2->read_offset + 0x40;
          pSVar2->read_count = pSVar2->read_count + 0x40;
        }
        parse_message(this,local_78);
        uVar9 = uVar9 + 0x40;
      } while (uVar9 <= uVar4);
    }
    pSVar2 = this->shm_block;
    LOCK();
    piVar7 = &pSVar2->futex_lock;
    iVar5 = *piVar7;
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (iVar5 == 2) {
      piVar7 = &pSVar2->futex_lock;
      LOCK();
      *piVar7 = 0;
      UNLOCK();
      syscall(0xca,piVar7,1,1,0,0,0);
    }
    PVar6 = (PollResult)(_Var1 != 0);
  }
  return PVar6;
}

Assistant:

ExternalReplayer::PollResult ExternalReplayer::Impl::poll_progress(ExternalReplayer::Progress &progress)
{
	bool complete = shm_block->progress_complete.load(std::memory_order_acquire) != 0;

	if (pid < 0 && !complete)
		return ExternalReplayer::PollResult::Error;

	// Try to avoid a situation where we're endlessly polling, in case the application died too early during startup and we failed
	// to catch it ending by receiving a completed wait through is_process_complete().
	if (!complete && pid >= 0)
	{
		int ret;
		// This serves as a check to see if process is still alive.
		if ((ret = waitpid(pid, &wstatus, WNOHANG)) > 0)
		{
			// Child process can receive SIGCONT/SIGSTOP which is benign.
			// This should normally only happen when the process is being debugged.
			if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus))
				reset_pid();
		}
		else if (ret < 0)
		{
			// The child does not exist anymore, and we were unable to reap it.
			// This can happen if the process installed a SIGCHLD handler behind our back.
			wstatus = -errno;
			synthesized_exit_code = true;
			reset_pid();
		}

		// If ret is 0, that means the process is still alive and nothing happened to it yet.
	}

	if (shm_block->progress_started.load(std::memory_order_acquire) == 0)
		return ExternalReplayer::PollResult::ResultNotReady;

	progress.compute.total = shm_block->total_compute.load(std::memory_order_relaxed);
	progress.compute.parsed = shm_block->parsed_compute.load(std::memory_order_relaxed);
	progress.compute.parsed_fail = shm_block->parsed_compute_failures.load(std::memory_order_relaxed);
	progress.compute.skipped = shm_block->skipped_compute.load(std::memory_order_relaxed);
	progress.compute.cached = shm_block->cached_compute.load(std::memory_order_relaxed);
	progress.compute.completed = shm_block->successful_compute.load(std::memory_order_relaxed);

	progress.graphics.total = shm_block->total_graphics.load(std::memory_order_relaxed);
	progress.graphics.parsed = shm_block->parsed_graphics.load(std::memory_order_relaxed);
	progress.graphics.parsed_fail = shm_block->parsed_graphics_failures.load(std::memory_order_relaxed);
	progress.graphics.skipped = shm_block->skipped_graphics.load(std::memory_order_relaxed);
	progress.graphics.cached = shm_block->cached_graphics.load(std::memory_order_relaxed);
	progress.graphics.completed = shm_block->successful_graphics.load(std::memory_order_relaxed);

	progress.raytracing.total = shm_block->total_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.parsed = shm_block->parsed_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.parsed_fail = shm_block->parsed_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.skipped = shm_block->skipped_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.cached = shm_block->cached_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.completed = shm_block->successful_raytracing.load(std::memory_order_relaxed);

	progress.completed_modules = shm_block->successful_modules.load(std::memory_order_relaxed);
	progress.missing_modules = shm_block->parsed_module_failures.load(std::memory_order_relaxed);
	progress.total_modules = shm_block->total_modules.load(std::memory_order_relaxed);
	progress.banned_modules = shm_block->banned_modules.load(std::memory_order_relaxed);
	progress.module_validation_failures = shm_block->module_validation_failures.load(std::memory_order_relaxed);
	progress.clean_crashes = shm_block->clean_process_deaths.load(std::memory_order_relaxed);
	progress.dirty_crashes = shm_block->dirty_process_deaths.load(std::memory_order_relaxed);

	progress.total_graphics_pipeline_blobs = shm_block->static_total_count_graphics.load(std::memory_order_relaxed);
	progress.total_compute_pipeline_blobs = shm_block->static_total_count_compute.load(std::memory_order_relaxed);
	progress.total_raytracing_pipeline_blobs = shm_block->static_total_count_raytracing.load(std::memory_order_relaxed);

	futex_wrapper_lock(&shm_block->futex_lock);
	size_t read_avail = shared_control_block_read_avail(shm_block);
	for (size_t i = ControlBlockMessageSize; i <= read_avail; i += ControlBlockMessageSize)
	{
		char buf[ControlBlockMessageSize] = {};
		shared_control_block_read(shm_block, buf, sizeof(buf));
		parse_message(buf);
	}
	futex_wrapper_unlock(&shm_block->futex_lock);
	return complete ? ExternalReplayer::PollResult::Complete : ExternalReplayer::PollResult::Running;
}